

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

date __thiscall jwt::payload::get_expires_at(payload *this)

{
  claim *this_00;
  allocator<char> local_39;
  string local_38;
  payload *local_18;
  payload *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"exp",&local_39);
  this_00 = get_payload_claim(this,&local_38);
  this_local = (payload *)claim::as_date(this_00);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return (date)(duration)this_local;
}

Assistant:

const date get_expires_at() const { return get_payload_claim("exp").as_date(); }